

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProjectSettings.cpp
# Opt level: O2

Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
ProjectSettings::readFromFile_abi_cxx11_
          (Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ProjectSettings *this,char *filename)

{
  reference_wrapper<const_yaml::Mapping> rVar1;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  rVar2;
  Mapping *pMVar3;
  Mapping *pMVar4;
  bool bVar5;
  Value *this_00;
  reference_wrapper<const_yaml::Mapping> *prVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  string *psVar11;
  path *__lhs;
  FILE *__stream;
  ulong uVar12;
  reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *prVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  char *filename_00;
  ExpectedRef<const_std::string,_std::string> *this_01;
  size_t sVar15;
  ExpectedRef<const_std::string,_std::string> type;
  ExpectedRef<const_Mapping,_std::string> automation;
  undefined1 local_2e8 [32];
  ExpectedRef<const_std::string,_std::string> filename_1;
  char *filename_local;
  ProjectSettings settings;
  undefined1 local_1b0 [32];
  string raw_file;
  Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  samplerate_result;
  ExpectedRef<const_Mapping,_std::string> map_audio_result;
  ExpectedRef<const_std::string,_std::string> video_config_result;
  ExpectedRef<const_Mapping,_std::string> map_video_result;
  ExpectedRef<const_Mapping,_std::string> config_result;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  top_result;
  
  this_01 = &type;
  filename_local = (char *)this;
  aAppDebugPrintf("Reading project settings from file %s");
  yaml::parse_abi_cxx11_(&top_result,(yaml *)this,filename_00);
  if (top_result.has_value_ == false) {
    pbVar14 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::error(&top_result);
    std::__cxx11::string::string((string *)&settings,(string *)pbVar14);
    Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&settings);
    std::__cxx11::string::~string((string *)&settings);
    goto LAB_0011f2cb;
  }
  this_00 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::value(&top_result);
  yaml::Value::getMapping_abi_cxx11_(&config_result,this_00);
  if (config_result.has_value_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&automation,"Top config entity is not an ojbect",(allocator<char> *)&type);
    settings.video.config_filename._M_dataplus._M_p =
         (pointer)&settings.video.config_filename.field_2;
    rVar1._M_data = (Mapping *)((long)&automation.field_0 + 0x10);
    if (automation.field_0.value_._M_data == (reference_wrapper<const_yaml::Mapping>)rVar1._M_data)
    {
      settings.video.config_filename.field_2._8_8_ = automation.field_0._24_8_;
    }
    else {
      settings.video.config_filename._M_dataplus._M_p =
           (pointer)automation.field_0.error_.error_._M_dataplus._M_p;
    }
    settings.video.config_filename._M_string_length =
         automation.field_0.error_.error_._M_string_length;
    automation.field_0.error_.error_._M_string_length = 0;
    automation.field_0._16_8_ = automation.field_0._16_8_ & 0xffffffffffffff00;
    automation.field_0._0_8_ = rVar1._M_data;
    Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)&settings);
    std::__cxx11::string::~string((string *)&settings);
    std::__cxx11::string::~string((string *)&automation);
  }
  else {
    prVar6 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&config_result);
    pMVar3 = prVar6->_M_data;
    ProjectSettings(&settings);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&automation,"video",(allocator<char> *)&type);
    yaml::Mapping::getMapping(&map_video_result,pMVar3,(string *)&automation);
    std::__cxx11::string::~string((string *)&automation);
    if (map_video_result.has_value_ == false) {
      pbVar14 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::error(&map_video_result);
      std::__cxx11::string::string((string *)&automation,(string *)pbVar14);
      Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,(UnexpectedType *)&automation);
      std::__cxx11::string::~string((string *)&automation);
    }
    else {
      prVar6 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&map_video_result);
      pMVar4 = prVar6->_M_data;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&automation,"config_file",(allocator<char> *)&type);
      yaml::Mapping::getString(&video_config_result,pMVar4,(string *)&automation);
      std::__cxx11::string::~string((string *)&automation);
      if (video_config_result.has_value_ == false) {
        pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::error(&video_config_result);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                       "Cannot read video config: ",pbVar14);
        automation.field_0.value_._M_data =
             (reference_wrapper<const_yaml::Mapping>)((long)&automation.field_0 + 0x10);
        rVar2._M_data =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&type.field_0 + 0x10);
        if (type.field_0.value_._M_data ==
            (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             )rVar2._M_data) {
          automation.field_0._24_8_ = type.field_0._24_8_;
        }
        else {
          automation.field_0.value_._M_data =
               (reference_wrapper<const_yaml::Mapping>)
               (reference_wrapper<const_yaml::Mapping>)type.field_0.value_._M_data;
        }
        automation.field_0._17_7_ = type.field_0._17_7_;
        automation.field_0._16_1_ = type.field_0._16_1_;
        automation.field_0.error_.error_._M_string_length =
             type.field_0.error_.error_._M_string_length;
        type.field_0.error_.error_._M_string_length = 0;
        type.field_0._16_1_ = 0;
        type.field_0._0_8_ = rVar2._M_data;
        Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&automation);
        std::__cxx11::string::~string((string *)&automation);
        std::__cxx11::string::~string((string *)&type);
      }
      else {
        Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::value(&video_config_result);
        std::__cxx11::string::_M_assign((string *)&settings);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&automation,"audio",(allocator<char> *)&type);
        yaml::Mapping::getMapping(&map_audio_result,pMVar3,(string *)&automation);
        std::__cxx11::string::~string((string *)&automation);
        if (map_audio_result.has_value_ == false) {
          pbVar14 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::error(&map_audio_result);
          std::__cxx11::string::string((string *)&automation,(string *)pbVar14);
          Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(__return_storage_ptr__,(UnexpectedType *)&automation);
          std::__cxx11::string::~string((string *)&automation);
        }
        else {
          prVar6 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value(&map_audio_result);
          pMVar4 = prVar6->_M_data;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&automation,"samplerate",(allocator<char> *)&type);
          yaml::Mapping::getInt(&samplerate_result,pMVar4,(string *)&automation);
          std::__cxx11::string::~string((string *)&automation);
          if (samplerate_result.has_value_ == false) {
            pbVar14 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::error(&samplerate_result);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &type,"Error reading samplerate: ",pbVar14);
            automation.field_0.value_._M_data =
                 (reference_wrapper<const_yaml::Mapping>)((long)&automation.field_0 + 0x10);
            rVar2._M_data =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&type.field_0 + 0x10);
            if (type.field_0.value_._M_data ==
                (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 )rVar2._M_data) {
              automation.field_0._24_8_ = type.field_0._24_8_;
            }
            else {
              automation.field_0.value_._M_data =
                   (reference_wrapper<const_yaml::Mapping>)
                   (reference_wrapper<const_yaml::Mapping>)type.field_0.value_._M_data;
            }
            automation.field_0._17_7_ = type.field_0._17_7_;
            automation.field_0._16_1_ = type.field_0._16_1_;
            automation.field_0.error_.error_._M_string_length =
                 type.field_0.error_.error_._M_string_length;
            type.field_0.error_.error_._M_string_length = 0;
            type.field_0._16_1_ = 0;
            type.field_0._0_8_ = rVar2._M_data;
            Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(__return_storage_ptr__,(UnexpectedType *)&automation);
            std::__cxx11::string::~string((string *)&automation);
          }
          else {
            plVar7 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value(&samplerate_result);
            settings.audio.samplerate = (int)*plVar7;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&automation,"channels",(allocator<char> *)&type);
            lVar8 = yaml::Mapping::getInt(pMVar4,(string *)&automation,2);
            settings.audio.channels = (int)lVar8;
            std::__cxx11::string::~string((string *)&automation);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&automation,"duration_sec",(allocator<char> *)&type);
            lVar8 = yaml::Mapping::getInt(pMVar4,(string *)&automation,0x78);
            std::__cxx11::string::~string((string *)&automation);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&automation,"bpm",(allocator<char> *)&type);
            lVar9 = yaml::Mapping::getInt(pMVar4,(string *)&automation,0x3c);
            std::__cxx11::string::~string((string *)&automation);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&automation,"rows_per_beat",(allocator<char> *)&type);
            lVar10 = yaml::Mapping::getInt(pMVar4,(string *)&automation,8);
            std::__cxx11::string::~string((string *)&automation);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&automation,"raw_file",(allocator<char> *)&filename_1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type,"",(allocator<char> *)local_2e8);
            psVar11 = yaml::Mapping::getString(pMVar4,(string *)&automation,(string *)&type);
            std::__cxx11::string::string((string *)&raw_file,(string *)psVar11);
            std::__cxx11::string::~string((string *)&type);
            std::__cxx11::string::~string((string *)&automation);
            settings.audio.samples_per_row =
                 (settings.audio.samplerate * 0x3c) / ((int)lVar10 * (int)lVar9);
            settings.audio.samples = 0;
            if (raw_file._M_string_length != 0) {
              std::experimental::filesystem::v1::__cxx11::path::
              path<char_const*,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)&type,&filename_local);
              __lhs = (path *)std::experimental::filesystem::v1::__cxx11::path::remove_filename
                                        ((path *)&type);
              std::experimental::filesystem::v1::__cxx11::path::
              path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                        ((path *)&filename_1,&raw_file);
              std::experimental::filesystem::v1::__cxx11::operator/
                        ((path *)&automation,__lhs,(path *)&filename_1);
              std::experimental::filesystem::v1::__cxx11::path::string
                        ((string *)local_2e8,(path *)&automation);
              __stream = fopen((char *)local_2e8._0_8_,"rb");
              std::__cxx11::string::~string((string *)local_2e8);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)&automation);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)&filename_1);
              std::experimental::filesystem::v1::__cxx11::path::~path((path *)&type);
              if (__stream != (FILE *)0x0) {
                fseek(__stream,0,2);
                uVar12 = ftell(__stream);
                settings.audio.samples = (int)(uVar12 / (ulong)((long)settings.audio.channels << 2))
                ;
                fseek(__stream,0,0);
                sVar15 = (size_t)settings.audio.samples;
                uVar12 = 0xffffffffffffffff;
                if (-1 < (long)sVar15) {
                  uVar12 = sVar15 * 8;
                }
                settings.audio.data = (float *)operator_new__(uVar12);
                sVar15 = fread(settings.audio.data,(long)settings.audio.channels << 2,sVar15,
                               __stream);
                if (settings.audio.samples != (int)sVar15 || settings.audio.samples == 0) {
                  if (settings.audio.data != (float *)0x0) {
                    operator_delete__(settings.audio.data);
                  }
                  settings.audio.data = (float *)0x0;
                }
                fclose(__stream);
              }
            }
            if (settings.audio.data == (float *)0x0) {
              aAppDebugPrintf("No raw audio available, continuing in silence");
              settings.audio.samples = (int)lVar8 * settings.audio.samplerate;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&type,"automation",(allocator<char> *)&filename_1);
            yaml::Mapping::getMapping(&automation,pMVar3,(string *)&type);
            std::__cxx11::string::~string((string *)&type);
            if (automation.has_value_ == true) {
              prVar6 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::value(&automation);
              pMVar4 = prVar6->_M_data;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&filename_1,"type",(allocator<char> *)local_2e8);
              yaml::Mapping::getString(&type,pMVar4,(string *)&filename_1);
              std::__cxx11::string::~string((string *)&filename_1);
              if (type.has_value_ != false) {
                prVar13 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::value(&type);
                pbVar14 = prVar13->_M_data;
                bVar5 = std::operator==(pbVar14,"Rocket");
                if (bVar5) {
                  settings.automation.type = Rocket;
                }
                else {
                  bVar5 = std::operator==(pbVar14,"Gui");
                  if (bVar5) {
                    settings.automation.type = Gui;
                  }
                  else {
                    bVar5 = std::operator==(pbVar14,"Basic");
                    if (bVar5) {
                      settings.automation.type = Basic;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)local_2e8,"file",(allocator<char> *)local_1b0);
                      yaml::Mapping::getString(&filename_1,pMVar4,(string *)local_2e8);
                      std::__cxx11::string::~string((string *)local_2e8);
                      if (filename_1.has_value_ == false) {
                        pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::error(&filename_1);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1b0,"Cannot read basic automation file: ",pbVar14);
                        local_2e8._0_8_ = local_2e8 + 0x10;
                        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b0._0_8_ ==
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_1b0 + 0x10)) {
                          local_2e8._24_8_ = local_1b0._24_8_;
                        }
                        else {
                          local_2e8._0_8_ = local_1b0._0_8_;
                        }
                        local_2e8._17_7_ = local_1b0._17_7_;
                        local_2e8[0x10] = local_1b0[0x10];
                        local_2e8._8_8_ = local_1b0._8_8_;
                        local_1b0._8_8_ = 0;
                        local_1b0[0x10] = '\0';
                        local_1b0._0_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_1b0 + 0x10);
                        Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::Expected(__return_storage_ptr__,(UnexpectedType *)local_2e8);
                        std::__cxx11::string::~string((string *)local_2e8);
                        std::__cxx11::string::~string((string *)local_1b0);
                      }
                      else {
                        Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::value(&filename_1);
                        std::__cxx11::string::_M_assign((string *)&settings.automation.filename);
                      }
                      Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~Expected(&filename_1);
                      if (filename_1.has_value_ == false) goto LAB_0011f25e;
                    }
                    else {
                      bVar5 = std::operator==(pbVar14,"None");
                      if (!bVar5) {
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2e8,"Unexpected automation type ",pbVar14);
                        goto LAB_0011eec0;
                      }
                    }
                  }
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected(&type);
                goto LAB_0011ef27;
              }
              pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::error(&type);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2e8,"Cannot read automation: ",pbVar14);
LAB_0011eec0:
              filename_1.field_0.value_._M_data =
                   (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )((long)&filename_1.field_0 + 0x10);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_2e8._0_8_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_2e8 + 0x10)) {
                filename_1.field_0._24_8_ = local_2e8._24_8_;
              }
              else {
                filename_1.field_0.value_._M_data =
                     (reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_2e8._0_8_;
              }
              filename_1.field_0.error_.error_._M_string_length = local_2e8._8_8_;
              local_2e8._8_8_ = 0;
              local_2e8._16_8_ = local_2e8._16_8_ & 0xffffffffffffff00;
              local_2e8._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_2e8 + 0x10);
              Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,(UnexpectedType *)&filename_1);
              std::__cxx11::string::~string((string *)&filename_1);
              std::__cxx11::string::~string((string *)local_2e8);
LAB_0011f25e:
              Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&type);
              Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&automation);
            }
            else {
LAB_0011ef27:
              Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&automation);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&type,"export",(allocator<char> *)&filename_1);
              yaml::Mapping::getMapping(&automation,pMVar3,(string *)&type);
              std::__cxx11::string::~string((string *)&type);
              if (automation.has_value_ == true) {
                prVar6 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::value(&automation);
                pMVar3 = prVar6->_M_data;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filename_1,"width",(allocator<char> *)local_2e8);
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&type,pMVar3,(string *)&filename_1);
                std::__cxx11::string::~string((string *)&filename_1);
                if (type.has_value_ == true) {
                  plVar7 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&type);
                  settings.exports.width = (int)*plVar7;
                }
                else {
                  pbVar14 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&type);
                  aAppDebugPrintf("Cannot read export.width: %s. Continuing with default",
                                  (pbVar14->_M_dataplus)._M_p);
                }
                Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&type);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filename_1,"height",(allocator<char> *)local_2e8);
                yaml::Mapping::getInt
                          ((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&type,pMVar3,(string *)&filename_1);
                std::__cxx11::string::~string((string *)&filename_1);
                if (type.has_value_ == true) {
                  plVar7 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::value((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&type);
                  settings.exports.height = (int)*plVar7;
                }
                else {
                  pbVar14 = Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&type);
                  aAppDebugPrintf("Cannot read export.height: %s. Continuing with default",
                                  (pbVar14->_M_dataplus)._M_p);
                }
                Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected((Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&type);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filename_1,"c_source",(allocator<char> *)local_2e8);
                yaml::Mapping::getString(&type,pMVar3,(string *)&filename_1);
                std::__cxx11::string::~string((string *)&filename_1);
                if (type.has_value_ == true) {
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&type);
                  std::__cxx11::string::_M_assign((string *)&settings.exports.c_source);
                }
                else {
                  pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error(&type);
                  aAppDebugPrintf("Cannot read export.c_source: %s. Continuing with default",
                                  (pbVar14->_M_dataplus)._M_p);
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected(&type);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filename_1,"shader_path",(allocator<char> *)local_2e8);
                yaml::Mapping::getString(&type,pMVar3,(string *)&filename_1);
                std::__cxx11::string::~string((string *)&filename_1);
                if (type.has_value_ == true) {
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&type);
                  std::__cxx11::string::_M_assign((string *)&settings.exports.shader_path);
                }
                else {
                  pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error(&type);
                  aAppDebugPrintf("Cannot read export.shader_path: %s. Continuing with default",
                                  (pbVar14->_M_dataplus)._M_p);
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected(&type);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&filename_1,"shader_suffix",(allocator<char> *)local_2e8);
                yaml::Mapping::getString(&type,pMVar3,(string *)&filename_1);
                std::__cxx11::string::~string((string *)&filename_1);
                if (type.has_value_ == true) {
                  Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value(&type);
                  std::__cxx11::string::_M_assign((string *)&settings.exports.shader_suffix);
                }
                else {
                  pbVar14 = Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::error(&type);
                  aAppDebugPrintf("Cannot read export.shader_suffix: %s. Continuing with default",
                                  (pbVar14->_M_dataplus)._M_p);
                }
                Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~Expected(&type);
              }
              else {
                pbVar14 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::error(&automation);
                aAppDebugPrintf("Cannot read export section: %s. Continuing with defaults",
                                (pbVar14->_M_dataplus)._M_p);
              }
              Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~Expected(&automation);
              Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Expected(__return_storage_ptr__,&settings);
            }
            this_01 = (ExpectedRef<const_std::string,_std::string> *)&raw_file;
          }
          std::__cxx11::string::~string((string *)this_01);
          Expected<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected(&samplerate_result);
        }
        Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Expected(&map_audio_result);
      }
      Expected<std::reference_wrapper<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&video_config_result);
    }
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&map_video_result);
    ~ProjectSettings(&settings);
  }
  Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&config_result);
LAB_0011f2cb:
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&top_result);
  return __return_storage_ptr__;
}

Assistant:

Expected<ProjectSettings, std::string> ProjectSettings::readFromFile(const char *filename) {
	MSG("Reading project settings from file %s", filename);

	const auto top_result = yaml::parse(filename);
	if (!top_result)
		return Unexpected(top_result.error());

	const yaml::Value &top = top_result.value();
	const auto config_result = top.getMapping();
	if (!config_result)
		return Unexpected<std::string>("Top config entity is not an ojbect");
	const yaml::Mapping &config = config_result.value();

	ProjectSettings settings;
	auto map_video_result = config.getMapping("video");
	if (!map_video_result)
		return Unexpected(map_video_result.error());
	auto video_config_result = map_video_result.value().get().getString("config_file");
	if (!video_config_result)
		return Unexpected("Cannot read video config: " + video_config_result.error());
	settings.video.config_filename = video_config_result.value();

	auto map_audio_result = config.getMapping("audio");
	if (!map_audio_result)
		return Unexpected(map_audio_result.error());
	const yaml::Mapping &yaudio = map_audio_result.value();
	auto samplerate_result = yaudio.getInt("samplerate");
	if (!samplerate_result)
		return Unexpected("Error reading samplerate: " + samplerate_result.error());
	settings.audio.samplerate = samplerate_result.value();
	settings.audio.channels = yaudio.getInt("channels", 2);

	const int duration_sec = yaudio.getInt("duration_sec", 120);
	const int bpm = yaudio.getInt("bpm", 60);
	const int rows_per_beat = yaudio.getInt("rows_per_beat", 8);
	const std::string raw_file = yaudio.getString("raw_file", "");

	settings.audio.samples_per_row = settings.audio.samplerate * 60 / (bpm * rows_per_beat);
	settings.audio.samples = 0;

	if (!raw_file.empty()) {
		FILE *f = fopen((fs::path(filename).remove_filename()/raw_file).string().c_str(), "rb");
		if (f) {
			fseek(f, 0L, SEEK_END);
			settings.audio.samples = ftell(f) / (sizeof(float) * settings.audio.channels);
			fseek(f, 0L, SEEK_SET);
			settings.audio.data = new float[settings.audio.samples * 2];
			const int samples_read = fread(settings.audio.data, sizeof(float) * settings.audio.channels, settings.audio.samples, f);
			if (settings.audio.samples != samples_read || !settings.audio.samples) {
				delete[] settings.audio.data;
				settings.audio.data = nullptr;
			}
			fclose(f);
		}
	}

	if (!settings.audio.data) {
		MSG("No raw audio available, continuing in silence");
		settings.audio.samples = settings.audio.samplerate * duration_sec;
	}

	if (auto automation = config.getMapping("automation")) {
		const yaml::Mapping &yautomation = automation.value();
		auto type = yautomation.getString("type");
		if (!type)
			return Unexpected("Cannot read automation: " + type.error());
		const std::string &ytype = type.value();
		if (ytype == "Rocket")
			settings.automation.type = Automation::Type::Rocket;
		else if (ytype == "Gui")
			settings.automation.type = Automation::Type::Gui;
		else if (ytype == "Basic") {
			settings.automation.type = Automation::Type::Basic;
			auto filename = yautomation.getString("file");
			if (!filename)
				return Unexpected("Cannot read basic automation file: " + filename.error());
			settings.automation.filename = filename.value();
		} else if (ytype == "None") {
		} else
			return Unexpected("Unexpected automation type " + ytype);
	}

	if (auto map_export = config.getMapping("export")) {
		const yaml::Mapping &exports = map_export.value();
	#define READ_VALUE(name, getType) \
		if (auto name = exports.getType(#name)) \
			settings.exports.name = name.value(); \
		else \
			MSG("Cannot read export." #name ": %s. Continuing with default", name.error().c_str())

		READ_VALUE(width, getInt);
		READ_VALUE(height, getInt);
		READ_VALUE(c_source, getString);
		READ_VALUE(shader_path, getString);
		READ_VALUE(shader_suffix, getString);
		//READ_VALUE(shader_concat, getInt);
	} else {
		MSG("Cannot read export section: %s. Continuing with defaults", map_export.error().c_str());
	}

	return settings;
}